

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_with_opts.c
# Opt level: O3

void parse_with_opts_should_return_parse_end(void)

{
  cJSON *item;
  long in_FS_OFFSET;
  char *parse_end;
  char json [18];
  char *local_30;
  char local_28 [24];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  builtin_strncpy(local_28,"[] empty array XD",0x12);
  local_30 = (char *)0x0;
  item = cJSON_ParseWithOpts(local_28,&local_30,0);
  if (item == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x4f);
  }
  UnityAssertEqualNumber
            ((UNITY_INT)(local_28 + 2),(UNITY_INT)local_30,(char *)0x0,0x50,
             UNITY_DISPLAY_STYLE_HEX64);
  cJSON_Delete(item);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parse_with_opts_should_return_parse_end(void)
{
    const char json[] = "[] empty array XD";
    const char *parse_end = NULL;

    cJSON *item = cJSON_ParseWithOpts(json, &parse_end, false);
    TEST_ASSERT_NOT_NULL(item);
    TEST_ASSERT_EQUAL_PTR(json + 2, parse_end);
    cJSON_Delete(item);
}